

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O2

uint * Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *pObj,Vec_Int_t *vTruth,int nWords)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  ulong uVar5;
  char *__assertion;
  ulong uVar6;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Hop_IsComplement(pObj)";
    uVar1 = 0x65;
LAB_005ffa59:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopTruth.c"
                  ,uVar1,
                  "unsigned int *Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *, Vec_Int_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 0x14) {
    puVar2 = Hop_ManConvertAigToTruth_rec2
                       ((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vTruth,nWords);
    puVar3 = Hop_ManConvertAigToTruth_rec2
                       ((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vTruth,nWords);
    puVar4 = Vec_IntFetch(vTruth,nWords);
    if ((*(uint *)&pObj->field_0x20 & 7) == 5) {
      uVar5 = 0;
      uVar6 = (ulong)(uint)nWords;
      if (nWords < 1) {
        uVar6 = 0;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        puVar4[uVar5] = puVar3[uVar5] ^ puVar2[uVar5];
      }
    }
    else {
      uVar1 = 0;
      if (0 < nWords) {
        uVar1 = nWords;
      }
      uVar5 = (ulong)uVar1;
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        if (((ulong)pObj->pFanin1 & 1) == 0) {
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            puVar4[uVar6] = puVar3[uVar6] & puVar2[uVar6];
          }
        }
        else {
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            puVar4[uVar6] = ~puVar3[uVar6] & puVar2[uVar6];
          }
        }
      }
      else if (((ulong)pObj->pFanin1 & 1) == 0) {
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          puVar4[uVar6] = ~puVar2[uVar6] & puVar3[uVar6];
        }
      }
      else {
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          puVar4[uVar6] = ~(puVar3[uVar6] | puVar2[uVar6]);
        }
      }
    }
    if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
      __assertion = "Hop_ObjIsMarkA(pObj)";
      uVar1 = 0x7c;
      goto LAB_005ffa59;
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffef;
    (pObj->field_0).pData = puVar4;
  }
  else {
    puVar4 = (uint *)(pObj->field_0).pData;
  }
  return puVar4;
}

Assistant:

unsigned * Hop_ManConvertAigToTruth_rec2( Hop_Obj_t * pObj, Vec_Int_t * vTruth, int nWords )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    int i;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return (unsigned *)pObj->pData;
    // compute the truth tables of the fanins
    pTruth0 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin0(pObj), vTruth, nWords );
    pTruth1 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin1(pObj), vTruth, nWords );
    // creat the truth table of the node
    pTruth  = Vec_IntFetch( vTruth, nWords );
    if ( Hop_ObjIsExor(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
    pObj->pData = pTruth;
    return pTruth;
}